

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall dgPolyhedra::dgPolyhedra(dgPolyhedra *this,dgPolyhedra *polyhedra)

{
  HaI32 HVar1;
  dgRedBackNode *pdVar2;
  int *index;
  unsigned_long *userdata;
  dgEdge *pdVar3;
  dgEdge *pdVar4;
  long lVar5;
  dgStack<int> indexPool;
  dgStack<unsigned_long> userPool;
  dgStack<int> local_60;
  Iterator local_50;
  dgStack<unsigned_long> local_40;
  
  (this->super_dgTree<dgEdge,_long>).m_count = 0;
  (this->super_dgTree<dgEdge,_long>).m_head = (dgTreeNode *)0x0;
  this->m_baseMark = 0;
  this->m_edgeMark = 0;
  (this->super_dgTree<dgEdge,_long>)._vptr_dgTree = (_func_int **)&PTR__dgPolyhedra_0118ea40;
  this->m_faceSecuence = 0;
  dgStack<int>::dgStack(&local_60,0x4000);
  dgStack<unsigned_long>::dgStack(&local_40,0x4000);
  index = dgStack<int>::operator[](&local_60,0);
  userdata = dgStack<unsigned_long>::operator[](&local_40,0);
  local_50.m_tree = &polyhedra->super_dgTree<dgEdge,_long>;
  local_50.m_ptr =
       &dgTree<dgEdge,_long>::Minimum(&polyhedra->super_dgTree<dgEdge,_long>)->super_dgRedBackNode;
  while (pdVar2 = local_50.m_ptr, (dgTreeNode *)local_50.m_ptr != (dgTreeNode *)0x0) {
    if (-1 < ((dgEdge *)((long)local_50.m_ptr + 0x28))->m_incidentFace) {
      pdVar3 = FindEdge(this,((dgEdge *)((long)local_50.m_ptr + 0x28))->m_incidentVertex,
                        ((dgEdge *)((long)local_50.m_ptr + 0x28))->m_twin->m_incidentVertex);
      if (pdVar3 == (dgEdge *)0x0) {
        pdVar3 = (dgEdge *)((long)pdVar2 + 0x28);
        lVar5 = 0;
        pdVar4 = pdVar3;
        do {
          userdata[lVar5] = pdVar4->m_userData;
          index[lVar5] = pdVar4->m_incidentVertex;
          lVar5 = lVar5 + 1;
          pdVar4 = pdVar4->m_next;
        } while (pdVar4 != pdVar3);
        pdVar4 = AddFace(this,(HaI32)lVar5,index,(HaI64 *)userdata);
        HVar1 = ((dgEdge *)((long)pdVar2 + 0x28))->m_incidentFace;
        pdVar3 = pdVar4;
        do {
          pdVar3->m_incidentFace = HVar1;
          pdVar3 = pdVar3->m_next;
        } while (pdVar3 != pdVar4);
      }
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_50,0);
  }
  EndFace(this);
  this->m_faceSecuence = polyhedra->m_faceSecuence;
  free(local_40.super_dgStackBase.m_ptr);
  free(local_60.super_dgStackBase.m_ptr);
  return;
}

Assistant:

dgPolyhedra::dgPolyhedra (const dgPolyhedra &polyhedra)
	:dgTree <dgEdge, hacd::HaI64>()
	,m_baseMark(0)
	,m_edgeMark(0)
	,m_faceSecuence(0)
{
	dgStack<hacd::HaI32> indexPool (1024 * 16);
	dgStack<hacd::HaU64> userPool (1024 * 16);
	hacd::HaI32* const index = &indexPool[0];
	hacd::HaU64* const user = &userPool[0];

	BeginFace ();
	Iterator iter(polyhedra);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_incidentFace < 0) {
			continue;
		}

		if (!FindEdge(edge->m_incidentVertex, edge->m_twin->m_incidentVertex))	{
			hacd::HaI32 indexCount = 0;
			dgEdge* ptr = edge;
			do {
				user[indexCount] = ptr->m_userData;
				index[indexCount] = ptr->m_incidentVertex;
				indexCount ++;
				ptr = ptr->m_next;
			} while (ptr != edge);

			dgEdge* const face = AddFace (indexCount, index, (hacd::HaI64*) user);
			ptr = face;
			do {
				ptr->m_incidentFace = edge->m_incidentFace;
				ptr = ptr->m_next;
			} while (ptr != face);
		}
	}
	EndFace();

	m_faceSecuence = polyhedra.m_faceSecuence;

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck());
#endif
}